

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenInitializer::RccListInputs
          (cmQtAutoGenInitializer *this,string *fileName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *error)

{
  uint uVar1;
  bool bVar2;
  string *this_00;
  int retVal;
  string rccStdOut;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string rccStdErr;
  string fileNameName;
  string fileDir;
  uint auStack_210 [122];
  
  bVar2 = cmsys::SystemTools::FileExists(fileName);
  if (!bVar2) {
    std::__cxx11::string::assign((char *)error);
    cmQtAutoGen::Quoted(&fileDir,fileName);
    std::__cxx11::string::append((string *)error);
    std::__cxx11::string::~string((string *)&fileDir);
    std::__cxx11::string::append((char *)error);
    return false;
  }
  if (((this->Rcc).super_GenVarsT.ExecutableExists == true) &&
     ((this->Rcc).ListOptions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->Rcc).ListOptions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    if ((this->Rcc).super_GenVarsT.Executable._M_string_length == 0) {
      std::__cxx11::string::assign((char *)error);
      return false;
    }
    cmsys::SystemTools::GetFilenamePath(&fileDir,fileName);
    cmsys::SystemTools::GetFilenameName(&fileNameName,fileName);
    retVal = 0;
    rccStdOut._M_dataplus._M_p = (pointer)&rccStdOut.field_2;
    rccStdOut._M_string_length = 0;
    rccStdOut.field_2._M_local_buf[0] = '\0';
    rccStdErr._M_dataplus._M_p = (pointer)&rccStdErr.field_2;
    rccStdErr._M_string_length = 0;
    rccStdErr.field_2._M_local_buf[0] = '\0';
    cmd.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cmd.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmd.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&cmd,&(this->Rcc).super_GenVarsT.Executable);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cmd,
               (const_iterator)
               cmd.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (this->Rcc).ListOptions.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->Rcc).ListOptions.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&cmd,&fileNameName);
    bVar2 = cmSystemTools::RunSingleCommand
                      (&cmd,&rccStdOut,&rccStdErr,&retVal,fileDir._M_dataplus._M_p,OUTPUT_NONE,
                       (cmDuration)0x0,Auto);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cmd);
    if (bVar2 && retVal == 0) {
      bVar2 = cmQtAutoGen::RccListParseOutput(&rccStdOut,&rccStdErr,files,error);
      std::__cxx11::string::~string((string *)&rccStdErr);
      std::__cxx11::string::~string((string *)&rccStdOut);
      std::__cxx11::string::~string((string *)&fileNameName);
      std::__cxx11::string::~string((string *)&fileDir);
      if (!bVar2) {
        return false;
      }
LAB_002d1846:
      cmsys::SystemTools::GetFilenamePath(&fileDir,fileName);
      cmQtAutoGen::RccListConvertFullPath(&fileDir,files);
      std::__cxx11::string::~string((string *)&fileDir);
      return true;
    }
    std::__cxx11::string::assign((char *)error);
    cmQtAutoGen::Quoted((string *)&cmd,fileName);
    std::__cxx11::string::append((string *)error);
    std::__cxx11::string::~string((string *)&cmd);
    std::__cxx11::string::append((char *)error);
    std::__cxx11::string::append((string *)error);
    std::__cxx11::string::append((char *)error);
    std::__cxx11::string::append((string *)error);
    std::__cxx11::string::append((char *)error);
    std::__cxx11::string::~string((string *)&rccStdErr);
    std::__cxx11::string::~string((string *)&rccStdOut);
    std::__cxx11::string::~string((string *)&fileNameName);
    this_00 = &fileDir;
  }
  else {
    rccStdOut._M_dataplus._M_p = (pointer)&rccStdOut.field_2;
    rccStdOut._M_string_length = 0;
    rccStdOut.field_2._M_local_buf[0] = '\0';
    std::ifstream::ifstream(&fileDir,(fileName->_M_dataplus)._M_p,_S_in);
    uVar1 = *(uint *)((long)auStack_210 + *(long *)(fileDir._M_dataplus._M_p + -0x18));
    if ((uVar1 & 5) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fileNameName);
      std::ostream::operator<<(&fileNameName,(streambuf *)fileDir.field_2._M_local_buf);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&rccStdOut,(string *)&rccStdErr);
      std::__cxx11::string::~string((string *)&rccStdErr);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fileNameName);
    }
    else {
      std::__cxx11::string::assign((char *)error);
      cmQtAutoGen::Quoted(&fileNameName,fileName);
      std::__cxx11::string::append((string *)error);
      std::__cxx11::string::~string((string *)&fileNameName);
      std::__cxx11::string::append((char *)error);
    }
    std::ifstream::~ifstream(&fileDir);
    if ((uVar1 & 5) == 0) {
      cmQtAutoGen::RccListParseContent(&rccStdOut,files);
      std::__cxx11::string::~string((string *)&rccStdOut);
      goto LAB_002d1846;
    }
    this_00 = &rccStdOut;
  }
  std::__cxx11::string::~string((string *)this_00);
  return false;
}

Assistant:

bool cmQtAutoGenInitializer::RccListInputs(std::string const& fileName,
                                           std::vector<std::string>& files,
                                           std::string& error)
{
  if (!cmSystemTools::FileExists(fileName)) {
    error = "rcc resource file does not exist:\n  ";
    error += Quoted(fileName);
    error += "\n";
    return false;
  }
  if (this->Rcc.ExecutableExists && !this->Rcc.ListOptions.empty()) {
    // Use rcc for file listing
    if (this->Rcc.Executable.empty()) {
      error = "rcc executable not available";
      return false;
    }

    // Run rcc list command in the directory of the qrc file with the
    // pathless
    // qrc file name argument. This way rcc prints relative paths.
    // This avoids issues on Windows when the qrc file is in a path that
    // contains non-ASCII characters.
    std::string const fileDir = cmSystemTools::GetFilenamePath(fileName);
    std::string const fileNameName = cmSystemTools::GetFilenameName(fileName);

    bool result = false;
    int retVal = 0;
    std::string rccStdOut;
    std::string rccStdErr;
    {
      std::vector<std::string> cmd;
      cmd.push_back(this->Rcc.Executable);
      cmd.insert(cmd.end(), this->Rcc.ListOptions.begin(),
                 this->Rcc.ListOptions.end());
      cmd.push_back(fileNameName);
      result = cmSystemTools::RunSingleCommand(
        cmd, &rccStdOut, &rccStdErr, &retVal, fileDir.c_str(),
        cmSystemTools::OUTPUT_NONE, cmDuration::zero(), cmProcessOutput::Auto);
    }
    if (!result || retVal) {
      error = "rcc list process failed for:\n  ";
      error += Quoted(fileName);
      error += "\n";
      error += rccStdOut;
      error += "\n";
      error += rccStdErr;
      error += "\n";
      return false;
    }
    if (!RccListParseOutput(rccStdOut, rccStdErr, files, error)) {
      return false;
    }
  } else {
    // We can't use rcc for the file listing.
    // Read the qrc file content into string and parse it.
    {
      std::string qrcContents;
      {
        cmsys::ifstream ifs(fileName.c_str());
        if (ifs) {
          std::ostringstream osst;
          osst << ifs.rdbuf();
          qrcContents = osst.str();
        } else {
          error = "rcc file not readable:\n  ";
          error += Quoted(fileName);
          error += "\n";
          return false;
        }
      }
      // Parse string content
      RccListParseContent(qrcContents, files);
    }
  }

  // Convert relative paths to absolute paths
  RccListConvertFullPath(cmSystemTools::GetFilenamePath(fileName), files);
  return true;
}